

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void compute_O_rc4_key(string *user_password,string *owner_password,EncryptionData *data,uchar *key)

{
  int key_len;
  logic_error *this;
  uchar *md;
  int iterations;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  MD5 md5;
  Digest digest;
  string password;
  unsigned_long local_28;
  
  if (data->V < 5) {
    md = key;
    std::__cxx11::string::string((string *)&password,(string *)owner_password);
    n = extraout_RDX;
    if (password._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&password);
      n = extraout_RDX_00;
      owner_password = user_password;
    }
    MD5::MD5(&md5,(uchar *)owner_password,n,md);
    pad_or_truncate_password_V4((string *)digest,&password);
    MD5::encodeDataIncrementally(&md5,(char *)digest._0_8_,0x20);
    std::__cxx11::string::~string((string *)digest);
    local_28 = 0x10;
    key_len = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_28);
    if (data->Length_bytes < key_len) {
      key_len = data->Length_bytes;
    }
    iterations = 0x32;
    if (data->R < 3) {
      iterations = 0;
    }
    iterate_md5_digest(&md5,&digest,iterations,key_len);
    *(undefined8 *)key = digest._0_8_;
    *(undefined8 *)(key + 8) = digest._8_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&password);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_O_rc4_key called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
compute_O_rc4_key(
    std::string const& user_password,
    std::string const& owner_password,
    QPDF::EncryptionData const& data,
    unsigned char key[OU_key_bytes_V4])
{
    if (data.getV() >= 5) {
        throw std::logic_error("compute_O_rc4_key called for file with V >= 5");
    }
    std::string password = owner_password;
    if (password.empty()) {
        password = user_password;
    }
    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    MD5::Digest digest;
    int key_len = std::min(QIntC::to_int(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    memcpy(key, digest, OU_key_bytes_V4);
}